

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

bool tinyxml2::XMLUtil::ToBool(char *str,bool *value)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int ival;
  
  iVar2 = __isoc99_sscanf(str,"%d");
  if (iVar2 == 1) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
    pcVar3 = "true";
    if (str != "true") {
      bVar6 = *str == '\0';
      if (*str == 't') {
        lVar1 = 1;
        do {
          lVar4 = lVar1;
          bVar6 = str[lVar4] == '\0';
          if ((bVar6) || (str[lVar4] != "true"[lVar4])) break;
          lVar1 = lVar4 + 1;
        } while ((int)lVar4 != 0x7fffffff);
        bVar7 = (int)lVar4 == 0x7fffffff;
        pcVar3 = "true" + lVar4;
      }
      else {
        bVar7 = false;
      }
      if ((!bVar7) && ((!bVar6 || (*pcVar3 != '\0')))) {
        pcVar3 = "false";
        if (str != "false") {
          bVar5 = *str == '\0';
          if (*str == 'f') {
            lVar1 = 1;
            do {
              lVar4 = lVar1;
              bVar5 = str[lVar4] == '\0';
              if ((bVar5) || (str[lVar4] != "false"[lVar4])) break;
              lVar1 = lVar4 + 1;
            } while ((int)lVar4 != 0x7fffffff);
            bVar6 = (int)lVar4 == 0x7fffffff;
            pcVar3 = "false" + lVar4;
          }
          else {
            bVar6 = false;
          }
          if (!bVar6) {
            if (!bVar5) {
              return false;
            }
            bVar5 = false;
            if (*pcVar3 != '\0') {
              return false;
            }
            goto LAB_00175d86;
          }
        }
        bVar5 = false;
      }
    }
  }
LAB_00175d86:
  *value = bVar5;
  return true;
}

Assistant:

bool XMLUtil::ToBool( const char* str, bool* value )
{
    int ival = 0;
    if ( ToInt( str, &ival )) {
        *value = (ival==0) ? false : true;
        return true;
    }
    if ( StringEqual( str, "true" ) ) {
        *value = true;
        return true;
    }
    else if ( StringEqual( str, "false" ) ) {
        *value = false;
        return true;
    }
    return false;
}